

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Decoration __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::TranslateInterpolationDecoration
          (TGlslangToSpvTraverser *this,TQualifier *qualifier)

{
  Decoration DVar1;
  
  DVar1 = DecorationMax;
  if ((((((uint)qualifier >> 0x1e & 1) == 0) &&
       (DVar1 = DecorationNoPerspective, ((ulong)qualifier >> 0x25 & 1) == 0)) &&
      (DVar1 = DecorationFlat, -1 < (int)(uint)qualifier)) &&
     (DVar1 = DecorationMax, ((ulong)qualifier >> 0x26 & 1) != 0)) {
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    DVar1 = DecorationExplicitInterpAMD;
  }
  return DVar1;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateInterpolationDecoration(const glslang::TQualifier& qualifier)
{
    if (qualifier.smooth)
        // Smooth decoration doesn't exist in SPIR-V 1.0
        return spv::DecorationMax;
    else if (qualifier.isNonPerspective())
        return spv::DecorationNoPerspective;
    else if (qualifier.flat)
        return spv::DecorationFlat;
    else if (qualifier.isExplicitInterpolation()) {
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::DecorationExplicitInterpAMD;
    }
    else
        return spv::DecorationMax;
}